

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>
::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *valueMap,Index columnIndex)

{
  rbtree_node<void_*> *i;
  Index IVar1;
  uint uVar2;
  pointer puVar3;
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
  *this_00;
  node_ptr prVar4;
  Index *pIVar5;
  rbtree_node<void_*> *prVar6;
  node_ptr prVar7;
  Index IVar8;
  rbtree_node<void_*> *prVar9;
  ulong uVar10;
  iterator ret;
  undefined1 local_68 [24];
  undefined8 uStack_50;
  Delete_disposer local_48;
  rbtree_node<void_*> *local_40;
  rbtree_node<void_*> *local_38;
  
  local_68._0_8_ = (rbtree_node<void_*> *)0x0;
  local_68._8_8_ = local_68;
  uStack_50._0_4_ = red_t;
  uStack_50._4_4_ = 0;
  i = (rbtree_node<void_*> *)(this + 0x18);
  local_68._16_8_ = local_68._8_8_;
  prVar6 = *(rbtree_node<void_*> **)(this + 0x20);
  while( true ) {
    if (prVar6 == i) {
      prVar6 = (rbtree_node<void_*> *)local_68._8_8_;
      while (prVar6 != (rbtree_node<void_*> *)local_68) {
        this_00 = *(vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
                    **)(this + 8);
        if (this_00 !=
            (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
             *)0x0) {
          uVar2 = *(uint *)&prVar6[1].parent_;
          uVar10 = (ulong)(uVar2 + 1);
          if ((ulong)(((long)(this_00->
                             super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->
                             super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)
              < uVar10) {
            std::
            vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
            ::resize(this_00,uVar10);
          }
          std::
          _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>>
          ::
          _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>const&>
                    ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>>
                      *)((ulong)uVar2 * 0x30 + **(long **)(this + 8)),
                     (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                      *)&prVar6[-1].color_);
        }
        prVar4 = prVar6->right_;
        if (prVar6->right_ == (node_ptr)0x0) {
          do {
            prVar9 = prVar6;
            prVar6 = ((iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>_*,_false>
                       *)&prVar9->parent_)->nodeptr_;
          } while (prVar9 == prVar6->right_);
          if (prVar9->right_ == prVar6) {
            prVar6 = prVar9;
          }
        }
        else {
          do {
            prVar6 = prVar4;
            prVar4 = prVar6->left_;
          } while (prVar6->left_ != (node_ptr)0x0);
        }
      }
      if (i != (rbtree_node<void_*> *)local_68) {
        prVar4 = *(node_ptr *)(this + 0x18);
        *(undefined8 *)(this + 0x18) = local_68._0_8_;
        *(undefined8 *)(this + 0x20) = local_68._8_8_;
        *(undefined8 *)(this + 0x28) = local_68._16_8_;
        if ((node_ptr)local_68._0_8_ == (node_ptr)0x0) {
          *(rbtree_node<void_*> **)(this + 0x20) = i;
          local_68._0_8_ = this + 0x28;
        }
        ((node_ptr)local_68._0_8_)->parent_ = i;
        prVar7 = prVar4;
        if (prVar4 == (node_ptr)0x0) {
          prVar7 = (node_ptr)(local_68 + 0x10);
        }
        prVar7->parent_ = (rbtree_node<void_*> *)local_68;
        local_68._0_8_ = prVar4;
      }
      while ((node_ptr)local_68._0_8_ != (node_ptr)0x0) {
        prVar4 = ((node_ptr)local_68._0_8_)->left_;
        if (prVar4 == (node_ptr)0x0) {
          prVar4 = ((node_ptr)local_68._0_8_)->right_;
          ((node_ptr)local_68._0_8_)->parent_ = (node_ptr)0x0;
          ((node_ptr)local_68._0_8_)->left_ = (node_ptr)0x0;
          ((node_ptr)local_68._0_8_)->right_ = (node_ptr)0x0;
          local_68._0_8_ = prVar4;
        }
        else {
          ((node_ptr)local_68._0_8_)->left_ = prVar4->right_;
          prVar4->right_ = (node_ptr)local_68._0_8_;
          local_68._0_8_ = prVar4;
        }
      }
      return;
    }
    uVar10 = (ulong)*(uint *)&((iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>_*,_false>
                                *)&prVar6[1].parent_)->nodeptr_;
    puVar3 = (valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar10)
    break;
    pIVar5 = (Index *)operator_new(0x30);
    IVar8 = columnIndex;
    if (columnIndex == 0xffffffff) {
      IVar8 = *(Index *)this;
    }
    IVar1 = puVar3[uVar10];
    *pIVar5 = IVar8;
    pIVar5[2] = 0;
    pIVar5[3] = 0;
    pIVar5[4] = 0;
    pIVar5[5] = 0;
    pIVar5[6] = 0;
    pIVar5[7] = 0;
    pIVar5[10] = IVar1;
    local_48.col_ =
         (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
          *)local_68;
    boost::intrusive::
    bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
    ::insert_unique((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                     *)&local_38,(const_iterator *)local_48.col_,(reference)&local_48);
    local_48.col_ =
         (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
          *)this;
    local_38 = prVar6;
    boost::intrusive::
    bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
    ::erase((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
             *)&local_40,(const_iterator *)i);
    Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
    ::Delete_disposer::operator()(&local_48,(Entry *)&prVar6[-1].color_);
    prVar6 = local_40;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
}

Assistant:

inline void Intrusive_set_column<Master_matrix>::reorder(const Row_index_map& valueMap,
                                                         [[maybe_unused]] Index columnIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  Column_support newSet;

  if constexpr (Master_matrix::Option_list::has_row_access) {
    for (auto it = column_.begin(); it != column_.end();) {
      Entry* newEntry = entryPool_->construct(
          columnIndex == Master_matrix::template get_null_value<Index>() ? RA_opt::columnIndex_ : columnIndex,
          valueMap.at(it->get_row_index()));
      if constexpr (!Master_matrix::Option_list::is_z2) {
        newEntry->set_element(it->get_element());
      }
      newSet.insert(newSet.end(), *newEntry);
      _delete_entry(it);                                          // increases it
      if constexpr (Master_matrix::Option_list::has_intrusive_rows) // intrusive list
        RA_opt::insert_entry(newEntry->get_row_index(), newEntry);
    }

    // when row is a set, all entries have to be deleted first, to avoid colliding when inserting
    if constexpr (!Master_matrix::Option_list::has_intrusive_rows) {  // set
      for (Entry& entry : newSet) {
        RA_opt::insert_entry(entry.get_row_index(), &entry);
      }
    }
  } else {
    for (auto it = column_.begin(); it != column_.end();) {
      Entry* newEntry = entryPool_->construct(valueMap.at(it->get_row_index()));
      if constexpr (!Master_matrix::Option_list::is_z2) {
        newEntry->set_element(it->get_element());
      }
      newSet.insert(newSet.end(), *newEntry);
      _delete_entry(it);  // increases it
    }
  }

  column_.swap(newSet);
}